

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  FT_Memory extmemory;
  long lVar1;
  int iVar2;
  bdf_property_t *pbVar3;
  FT_String *pFVar4;
  FT_Bitmap_Size *pFVar5;
  FT_Long FVar6;
  FT_Pointer pvVar7;
  bdf_property_t *pbVar8;
  char *pcVar9;
  short local_ec;
  short local_e8;
  int local_e4;
  FT_Long local_e0;
  short local_d4;
  undefined1 local_d0 [8];
  FT_CharMapRec charmap_1;
  FT_CharMapRec charmap;
  char *s;
  FT_Bool unicode_charmap;
  bdf_property_t *charset_encoding;
  bdf_property_t *charset_registry;
  unsigned_long n;
  bdf_glyph_t *cur;
  long value;
  FT_Short resolution_y;
  FT_Short resolution_x;
  FT_Bitmap_Size *bsize;
  bdf_property_t *prop;
  bdf_options_t options;
  bdf_font_t *font;
  FT_Memory memory;
  BDF_Face face;
  FT_Parameter *pFStack_30;
  FT_Error error;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face bdfface_local;
  FT_Stream stream_local;
  
  face._4_4_ = 0;
  extmemory = bdfface->memory;
  options.keep_comments = 0;
  options.font_spacing = 0;
  pFStack_30 = params;
  params_local._0_4_ = num_params;
  params_local._4_4_ = face_index;
  _num_params_local = bdfface;
  bdfface_local = (FT_Face)stream;
  face._4_4_ = FT_Stream_Seek(stream,0);
  if (face._4_4_ == 0) {
    prop._0_4_ = 1;
    prop._4_4_ = 1;
    options.correct_metrics = 0;
    options.keep_unencoded = 8;
    face._4_4_ = bdf_load_font((FT_Stream)bdfface_local,extmemory,(bdf_options_t *)&prop,
                               (bdf_font_t **)&options.keep_comments);
    if ((face._4_4_ & 0xff) == 0xb0) {
      BDF_Face_Done(_num_params_local);
      return 2;
    }
    if (face._4_4_ == 0) {
      bdfface[1].face_flags = options._8_8_;
      if ((0 < (int)params_local._4_4_) && ((params_local._4_4_ & 0xffff) != 0)) {
        BDF_Face_Done(_num_params_local);
        return 6;
      }
      _num_params_local->num_faces = 1;
      _num_params_local->face_index = 0;
      _num_params_local->face_flags = _num_params_local->face_flags | 0x92;
      pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"SPACING");
      if ((((pbVar3 != (bdf_property_t *)0x0) && (pbVar3->format == 1)) &&
          ((pbVar3->value).atom != (char *)0x0)) &&
         (((*(pbVar3->value).atom == 'M' || (*(pbVar3->value).atom == 'm')) ||
          ((*(pbVar3->value).atom == 'C' || (*(pbVar3->value).atom == 'c')))))) {
        _num_params_local->face_flags = _num_params_local->face_flags | 4;
      }
      pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"FAMILY_NAME");
      if ((pbVar3 == (bdf_property_t *)0x0) || ((pbVar3->value).atom == (char *)0x0)) {
        _num_params_local->family_name = (FT_String *)0x0;
      }
      else {
        pFVar4 = (FT_String *)
                 ft_mem_strdup(extmemory,(pbVar3->value).atom,(FT_Error *)((long)&face + 4));
        _num_params_local->family_name = pFVar4;
        if (face._4_4_ != 0) {
          return face._4_4_;
        }
      }
      face._4_4_ = bdf_interpret_style((BDF_Face)bdfface);
      if (face._4_4_ == 0) {
        _num_params_local->num_glyphs = *(long *)(options._8_8_ + 0x50) + 1;
        _num_params_local->num_fixed_sizes = 1;
        pFVar5 = (FT_Bitmap_Size *)
                 ft_mem_realloc(extmemory,0x20,0,1,(void *)0x0,(FT_Error *)((long)&face + 4));
        _num_params_local->available_sizes = pFVar5;
        if (face._4_4_ == 0) {
          pFVar5 = _num_params_local->available_sizes;
          value._6_2_ = 0;
          value._4_2_ = 0;
          memset(pFVar5,0,0x20);
          if ((0x7fff < *(long *)(options._8_8_ + 0x40)) ||
             (*(long *)(options._8_8_ + 0x40) < -0x7fff)) {
            iVar2 = 0x7fff;
            if (*(long *)(options._8_8_ + 0x40) < 0) {
              iVar2 = -0x7fff;
            }
            *(long *)(options._8_8_ + 0x40) = (long)iVar2;
          }
          if ((0x7fff < *(long *)(options._8_8_ + 0x48)) ||
             (*(long *)(options._8_8_ + 0x48) < -0x7fff)) {
            iVar2 = 0x7fff;
            if (*(long *)(options._8_8_ + 0x48) < 0) {
              iVar2 = -0x7fff;
            }
            *(long *)(options._8_8_ + 0x48) = (long)iVar2;
          }
          pFVar5->height =
               (short)*(undefined8 *)(options._8_8_ + 0x40) +
               (short)*(undefined8 *)(options._8_8_ + 0x48);
          pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"AVERAGE_WIDTH");
          if (pbVar3 == (bdf_property_t *)0x0) {
            FVar6 = FT_MulDiv((long)pFVar5->height,2,3);
            pFVar5->width = (FT_Short)FVar6;
          }
          else if (((pbVar3->value).l < 0x4fff2) && (-0x4fff2 < (pbVar3->value).l)) {
            if ((short)(((pbVar3->value).l + 5) / 10) < 0) {
              local_d4 = -(short)(((pbVar3->value).l + 5) / 10);
            }
            else {
              local_d4 = (short)(((pbVar3->value).l + 5) / 10);
            }
            pFVar5->width = local_d4;
          }
          else {
            pFVar5->width = 0x7fff;
          }
          pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"POINT_SIZE");
          if (pbVar3 == (bdf_property_t *)0x0) {
            if (*(long *)(options._8_8_ + 0x18) == 0) {
              pFVar5->size = (long)((int)pFVar5->width << 6);
            }
            else if (*(ulong *)(options._8_8_ + 0x18) < 0x8000) {
              pFVar5->size = *(long *)(options._8_8_ + 0x18) << 6;
            }
            else {
              pFVar5->size = 0x7fff;
            }
          }
          else if (((pbVar3->value).l < 0x504c3) && (-0x504c3 < (pbVar3->value).l)) {
            if ((pbVar3->value).l < 0) {
              local_e0 = -(pbVar3->value).l;
            }
            else {
              local_e0 = (pbVar3->value).l;
            }
            FVar6 = FT_MulDiv(local_e0,0x70800,0x11a4e);
            pFVar5->size = FVar6;
          }
          else {
            pFVar5->size = 0x7fff;
          }
          pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"PIXEL_SIZE");
          if (pbVar3 != (bdf_property_t *)0x0) {
            if (((pbVar3->value).l < 0x8000) && (-0x8000 < (pbVar3->value).l)) {
              if ((short)(pbVar3->value).l < 0) {
                local_e4 = -(int)(short)(pbVar3->value).l;
              }
              else {
                local_e4 = (int)(short)(pbVar3->value).l;
              }
              pFVar5->y_ppem = (long)(local_e4 << 6);
            }
            else {
              pFVar5->y_ppem = 0x1fffc0;
            }
          }
          pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"RESOLUTION_X");
          if (pbVar3 == (bdf_property_t *)0x0) {
            cur = *(bdf_glyph_t **)(options._8_8_ + 0x20);
          }
          else {
            cur = (bdf_glyph_t *)(pbVar3->value).atom;
          }
          if (cur != (bdf_glyph_t *)0x0) {
            if (((long)cur < 0x8000) && (-0x8000 < (long)cur)) {
              local_e8 = (short)cur;
              if (local_e8 < 0) {
                local_e8 = -local_e8;
              }
              value._6_2_ = local_e8;
            }
            else {
              value._6_2_ = 0x7fff;
            }
          }
          pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"RESOLUTION_Y");
          if (pbVar3 == (bdf_property_t *)0x0) {
            cur = *(bdf_glyph_t **)(options._8_8_ + 0x28);
          }
          else {
            cur = (bdf_glyph_t *)(pbVar3->value).atom;
          }
          if (cur != (bdf_glyph_t *)0x0) {
            if (((long)cur < 0x8000) && (-0x8000 < (long)cur)) {
              local_ec = (short)cur;
              if (local_ec < 0) {
                local_ec = -local_ec;
              }
              value._4_2_ = local_ec;
            }
            else {
              value._4_2_ = 0x7fff;
            }
          }
          if ((pFVar5->y_ppem == 0) && (pFVar5->y_ppem = pFVar5->size, value._4_2_ != 0)) {
            FVar6 = FT_MulDiv(pFVar5->y_ppem,(long)value._4_2_,0x48);
            pFVar5->y_ppem = FVar6;
          }
          if ((value._6_2_ == 0) || (value._4_2_ == 0)) {
            pFVar5->x_ppem = pFVar5->y_ppem;
          }
          else {
            FVar6 = FT_MulDiv(pFVar5->y_ppem,(long)value._6_2_,(long)value._4_2_);
            pFVar5->x_ppem = FVar6;
          }
          lVar1 = *(long *)(options._8_8_ + 0x60);
          pvVar7 = ft_mem_realloc(extmemory,0x10,0,*(FT_Long *)(options._8_8_ + 0x50),(void *)0x0,
                                  (FT_Error *)((long)&face + 4));
          bdfface[1].style_flags = (FT_Long)pvVar7;
          if (face._4_4_ == 0) {
            bdfface[1].num_fixed_sizes = 0;
            for (charset_registry = (bdf_property_t *)0x0;
                charset_registry < *(bdf_property_t **)(options._8_8_ + 0x50);
                charset_registry = (bdf_property_t *)((long)&charset_registry->name + 1)) {
              *(undefined8 *)(bdfface[1].style_flags + (long)charset_registry * 0x10) =
                   *(undefined8 *)(lVar1 + (long)charset_registry * 0x38 + 8);
              *(short *)(bdfface[1].style_flags + (long)charset_registry * 0x10 + 8) =
                   (short)charset_registry;
              if ((*(long *)(lVar1 + (long)charset_registry * 0x38 + 8) ==
                   *(long *)(options._8_8_ + 0x38)) &&
                 (charset_registry < (bdf_property_t *)0xffffffff)) {
                bdfface[1].num_fixed_sizes = (FT_Int)charset_registry;
              }
            }
            pbVar3 = bdf_get_font_property((bdf_font_t *)options._8_8_,"CHARSET_REGISTRY");
            pbVar8 = bdf_get_font_property((bdf_font_t *)options._8_8_,"CHARSET_ENCODING");
            if ((((pbVar3 == (bdf_property_t *)0x0) || (pbVar8 == (bdf_property_t *)0x0)) ||
                (pbVar3->format != 1)) ||
               (((pbVar8->format != 1 || ((pbVar3->value).atom == (char *)0x0)) ||
                ((pbVar8->value).atom == (char *)0x0)))) {
              charmap_1.face._0_4_ = 0x41444f42;
              charmap_1.face._4_2_ = 7;
              charmap_1.face._6_2_ = 0;
              local_d0 = (undefined1  [8])bdfface;
              face._4_4_ = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_d0,
                                       (FT_CMap_conflict *)0x0);
              if (_num_params_local->num_charmaps != 0) {
                _num_params_local->charmap = *_num_params_local->charmaps;
              }
            }
            else {
              pvVar7 = ft_mem_strdup(extmemory,(pbVar8->value).atom,(FT_Error *)((long)&face + 4));
              bdfface[1].num_faces = (FT_Long)pvVar7;
              if (face._4_4_ == 0) {
                pvVar7 = ft_mem_strdup(extmemory,(pbVar3->value).atom,(FT_Error *)((long)&face + 4))
                ;
                bdfface[1].face_index = (FT_Long)pvVar7;
                if (face._4_4_ == 0) {
                  pcVar9 = (char *)bdfface[1].face_index;
                  if (((*pcVar9 == 'i') || (*pcVar9 == 'I')) &&
                     (((pcVar9[1] == 's' || (pcVar9[1] == 'S')) &&
                      ((pcVar9[2] == 'o' || (pcVar9[2] == 'O')))))) {
                    pcVar9 = pcVar9 + 3;
                    iVar2 = strcmp(pcVar9,"10646");
                    if ((iVar2 != 0) &&
                       (((iVar2 = strcmp(pcVar9,"8859"), iVar2 != 0 ||
                         (iVar2 = strcmp((char *)bdfface[1].num_faces,"1"), iVar2 != 0)) &&
                        (iVar2 = strcmp(pcVar9,"646.1991"), iVar2 == 0)))) {
                      strcmp((char *)bdfface[1].num_faces,"IRV");
                    }
                  }
                  charmap_1._8_8_ = bdfface;
                  face._4_4_ = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,
                                           (FT_CharMap)&charmap_1.encoding,(FT_CMap_conflict *)0x0);
                }
              }
            }
          }
        }
      }
    }
  }
  return face._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }